

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O2

scoped_dfs_traverser * __thiscall
clipp::detail::scoped_dfs_traverser::operator++(scoped_dfs_traverser *this)

{
  bool bVar1;
  group *g;
  scoped_dfs_traverser *this_00;
  
  if ((this->pos_).stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->pos_).stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return this;
  }
  bVar1 = group::depth_first_traverser::is_last_in_path(&this->pos_);
  if (bVar1) {
    return_to_outermost_scope(this);
    return this;
  }
  if (((this->ignoreBlocks_ != false) || (bVar1 = matched(this), bVar1)) ||
     (((this->pos_).stack_.
       super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current)->type_ == group)) {
LAB_0013b77d:
    group::depth_first_traverser::operator++(&this->pos_);
  }
  else {
    g = group::depth_first_traverser::outermost_blocking_group_fully_explored(&this->pos_);
    if ((g == (group *)0x0) ||
       (bVar1 = group::depth_first_traverser::is_inside(&this->lastMatch_,g), bVar1)) {
      bVar1 = group::child_t<clipp::parameter,_clipp::group>::blocking
                        ((this->pos_).stack_.
                         super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current);
      if (!bVar1) goto LAB_0013b77d;
      this_00 = this;
      if (((this->pos_).stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].parent)->exclusive_ != true)
      goto LAB_0013b7ab;
      group::depth_first_traverser::next_sibling(&this->pos_);
    }
    else {
      this_00 = (scoped_dfs_traverser *)
                group::depth_first_traverser::back_to_ancestor(&this->pos_,g);
LAB_0013b7ab:
      group::depth_first_traverser::next_after_siblings(&this_00->pos_);
    }
    if ((this->pos_).stack_.
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->pos_).stack_.
        super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return_to_outermost_scope(this);
    }
  }
  check_if_left_scope(this);
  return this;
}

Assistant:

scoped_dfs_traverser&
    operator ++ ()
    {
        if(!pos_) return *this;

        if(pos_.is_last_in_path()) {
            return_to_outermost_scope();
            return *this;
        }

        //current pattern can block if it didn't match already
        if(ignoreBlocks_ || matched()) {
            ++pos_;
        }
        else if(!pos_->is_group()) {
            //current group can block if we didn't have any match in it
            const group* g = pos_.outermost_blocking_group_fully_explored();
            //no match in 'g' before -> skip to after its siblings
            if(g && !lastMatch_.is_inside(g)) {
                pos_.back_to_ancestor(g).next_after_siblings();
                if(!pos_) return_to_outermost_scope();
            }
            else if(pos_->blocking()) {
                if(pos_.parent().exclusive()) {
                    pos_.next_sibling();
                } else {
                    //no match => skip siblings of blocking param
                    pos_.next_after_siblings();
                }
                if(!pos_) return_to_outermost_scope();
            } else {
                ++pos_;
            }
        } else {
            ++pos_;
        }
        check_if_left_scope();
        return *this;
    }